

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httpreadwrite.c
# Opt level: O3

int http_EndHttpRequest(void *Handle,int timeout)

{
  int iVar1;
  uint uVar2;
  int local_4;
  
  if (Handle == (void *)0x0) {
    uVar2 = 0xffffff9b;
  }
  else {
    uVar2 = 0;
    if ((*(int *)((long)Handle + 0x280) != 0) &&
       (*(undefined4 *)((long)Handle + 0x280) = 0, uVar2 = 0, *(int *)((long)Handle + 0x88) == -3))
    {
      iVar1 = sock_write((SOCKINFO *)Handle,"0\r\n\r\n",5,&local_4);
      uVar2 = iVar1 >> 0x1f & 0xffffff37;
    }
  }
  return uVar2;
}

Assistant:

int http_EndHttpRequest(void *Handle, int timeout)
{
	int retc = 0;
	const char *zcrlf = "0\r\n\r\n";
	http_connection_handle_t *handle = Handle;
	if (!handle)
		return UPNP_E_INVALID_PARAM;
	if (!handle->requestStarted) {
		return UPNP_E_SUCCESS;
	}
	handle->requestStarted = 0;
	if (handle->contentLength == UPNP_USING_CHUNKED)
		/*send last chunk */
		retc = sock_write(
			&handle->sock_info, zcrlf, strlen(zcrlf), &timeout);

	return retc >= 0 ? UPNP_E_SUCCESS : UPNP_E_SOCKET_WRITE;
}